

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>_>
 __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
iterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::TypedTermList>
          (SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *this,TypedTermList query,
          bool retrieveSubstitutions,bool reversed)

{
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *pSVar1;
  Self SVar2;
  char cVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000009;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *p;
  TermList TVar5;
  undefined1 local_a2;
  undefined1 local_a1;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *local_a0;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  local_98;
  anon_class_40_5_898dd9c1 local_88;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  TVar5 = query.super_TermList._content;
  local_a0 = this;
  if (*(long **)(TVar5._content + 8) == (long *)0x0) {
    cVar3 = '\x01';
  }
  else {
    cVar3 = (**(code **)(**(long **)(TVar5._content + 8) + 0x18))();
  }
  pSVar1 = local_a0;
  if (cVar3 == '\0') {
    local_88._16_8_ = *(undefined8 *)(TVar5._content + 8);
    local_48 = &local_88.field_0x20;
    local_58._0_8_ = &local_88.field_0x18;
    local_58._8_8_ = &local_88.field_0x10;
    local_40 = &local_a1;
    local_38 = &local_a2;
    local_a1 = reversed;
    local_88._24_8_ = TVar5._content;
    local_88._32_8_ = query._sort._content._content;
    local_60 = CONCAT71(in_register_00000009,retrieveSubstitutions);
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Kernel::TypedTermList,_bool,_bool>
    ::anon_class_40_5_898dd9c1::operator()(&local_88);
    ::Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (&local_98,(Lib *)&local_88,p);
    puVar4 = (undefined8 *)
             ::Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    SVar2._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         local_98._iter._p._self._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
         ._M_head_impl;
    pSVar1 = local_a0;
    local_98._iter._p._self._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>,_true,_true>
          )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            )0x0;
    *(undefined4 *)(puVar4 + 1) = 0;
    *puVar4 = &PTR__ProxyIterator_00b56a68;
    ((_Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
      *)(puVar4 + 2))->_M_head_impl =
         (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)SVar2._M_t.
            super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
            .
            super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
            ._M_head_impl;
    local_58._0_8_ =
         (__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
          )0x0;
    *(undefined8 **)local_a0 = puVar4;
    *(undefined4 *)(puVar4 + 1) = 1;
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)local_58);
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_98);
    ::Lib::
    Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_88);
  }
  else {
    ::Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>_>
    ::getEmpty();
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>_>
            *)pSVar1;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }